

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

void __thiscall
Lib::
SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::SListIntermediateNode::NodePtrComparator>
::~SkipList(SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::SListIntermediateNode::NodePtrComparator>
            *this)

{
  SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::SListIntermediateNode::NodePtrComparator>
  *in_RDI;
  uint in_stack_ffffffffffffffec;
  
  makeEmpty(in_RDI);
  deallocate((Node *)in_RDI,in_stack_ffffffffffffffec);
  return;
}

Assistant:

~SkipList()
  {
    makeEmpty();
    deallocate(_left,SKIP_LIST_MAX_HEIGHT);
  }